

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Tex2DCompletenessCase::iterate(Tex2DCompletenessCase *this)

{
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 seed;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *log_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference texCoord_00;
  undefined1 local_108 [7];
  bool isOk;
  Vector<float,_2> local_e0;
  Vector<float,_2> local_d8;
  int local_d0;
  int local_cc;
  int offsetY;
  int offsetX;
  Random random;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_90 [8];
  Surface renderedFrame;
  TextureRenderer renderer;
  TestLog *log;
  int viewportHeight;
  int viewportWidth;
  Tex2DCompletenessCase *this_local;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iVar2 = de::min<int>(0x40,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = de::min<int>(0x40,iVar3);
  log_00 = tcu::TestContext::getLog(this->m_testCtx);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            ((TextureRenderer *)&renderedFrame.m_pixels.m_cap,this->m_renderCtx,log_00,
             GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface((Surface *)local_90,iVar2,iVar3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z);
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar5);
  de::Random::Random((Random *)&offsetY,seed);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar4));
  local_cc = de::Random::getInt((Random *)&offsetY,0,iVar4 - iVar2);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar4));
  local_d0 = de::Random::getInt((Random *)&offsetY,0,iVar4 - iVar3);
  tcu::Vector<float,_2>::Vector(&local_d8,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&local_e0,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z,&local_d8,&local_e0);
  glwViewport(local_cc,local_d0,iVar2,iVar3);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])();
  texCoord_00 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            ((TextureRenderer *)&renderedFrame.m_pixels.m_cap,0,texCoord_00,TEXTURETYPE_2D);
  iVar3 = local_cc;
  iVar2 = local_d0;
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_108,(Surface *)local_90);
  glu::readPixels(context,iVar3,iVar2,(PixelBufferAccess *)local_108);
  bVar1 = compareToConstantColor
                    (log_00,"Result","Image comparison result",(Surface *)local_90,
                     COMPARE_LOG_RESULT,(RGBA)(this->m_compareColor).m_value);
  pcVar5 = "Image comparison failed";
  if (bVar1) {
    pcVar5 = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(byte)~bVar1 & QP_TEST_RESULT_FAIL,pcVar5);
  de::Random::~Random((Random *)&offsetY);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z);
  tcu::Surface::~Surface((Surface *)local_90);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer
            ((TextureRenderer *)&renderedFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

Tex2DCompletenessCase::IterateResult Tex2DCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, m_renderCtx.getRenderTarget().getWidth()		- viewportWidth	);
	int					offsetY			= random.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);

	computeQuadTexCoord2D	(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

	createTexture			();
	renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_2D);
	glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

	bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}